

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton.h
# Opt level: O1

void __thiscall es::init::ActionOnZero::operator()(ActionOnZero *this)

{
  code *pcVar1;
  anon_union_16_2_61a8b2f2_for__u aVar2;
  atomic<bool> aVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  long lVar6;
  bool bVar7;
  
  aVar3._M_base._M_i = operator()::activated._M_base._M_i;
  LOCK();
  operator()::activated._M_base._M_i = (__atomic_base<bool>)true;
  UNLOCK();
  if (((byte)aVar3._M_base._M_i & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ActionOnZero(): Already activated\n",0x22);
    return;
  }
  LOCK();
  _ZN2es4initL14clean_up_phaseE_0 = 1;
  UNLOCK();
LAB_00102a6c:
  puVar4 = (undefined8 *)0x0;
  lVar6 = 0;
  LOCK();
  if ((anon_union_16_2_61a8b2f2_for__u)ZEXT816(0) ==
      static_obj_stack<es::init::singletons_meta_data>::top._u) {
    static_obj_stack<es::init::singletons_meta_data>::top._u =
         (anon_union_16_2_61a8b2f2_for__u)ZEXT816(0);
  }
  else {
    lVar6 = static_obj_stack<es::init::singletons_meta_data>::top._u._8_8_;
    puVar4 = static_obj_stack<es::init::singletons_meta_data>::top._u._0_8_;
  }
  UNLOCK();
  puVar5 = (undefined8 *)0x0;
  if (puVar4 != (undefined8 *)0x0) goto code_r0x00102a8a;
  goto LAB_00102aa4;
code_r0x00102a8a:
  LOCK();
  aVar2._s._seq = lVar6;
  aVar2._s._p = (singletons_meta_data *)puVar4;
  bVar7 = (anon_union_16_2_61a8b2f2_for__u)aVar2._unit ==
          static_obj_stack<es::init::singletons_meta_data>::top._u;
  if (bVar7) {
    static_obj_stack<es::init::singletons_meta_data>::top._u._s._seq = lVar6 + 1;
    static_obj_stack<es::init::singletons_meta_data>::top._u._s._p = (singletons_meta_data *)*puVar4
    ;
  }
  UNLOCK();
  puVar5 = puVar4;
  if (bVar7) {
LAB_00102aa4:
    if (puVar5 == (undefined8 *)0x0) {
      return;
    }
    pcVar1 = (code *)puVar5[1];
    if (pcVar1 != (code *)0x0) {
      puVar5[1] = 0;
      (*pcVar1)();
    }
  }
  goto LAB_00102a6c;
}

Assistant:

void operator()() const
    {
        static std::atomic<bool> activated{false};

        if constexpr (verbose_singletons)
            std::cout << "ActionOnZero(): calling empty_stack(): from: " << __PRETTY_FUNCTION__ << "\n";
        if (activated.exchange(true))
        {
            std::cout << "ActionOnZero(): Already activated\n";
            return;
        }
        empty_stack();
    }